

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O0

Color * __thiscall
Scene::shade(Color *__return_storage_ptr__,Scene *this,Medium *curMed,double weight,Vector *p,
            Vector *view,GeometricObject *obj)

{
  double dVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  __shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var5;
  element_type *peVar6;
  double extraout_XMM0_Qa;
  double dVar7;
  __type _Var8;
  double dVar9;
  double local_4a0;
  double local_488;
  Color local_450;
  Vector local_438;
  Color local_420;
  Vector local_408;
  Vector local_3f0;
  Vector local_3d8;
  Vector local_3c0;
  double local_3a8;
  double ctSq;
  double ci;
  double eta_1;
  Vector local_378;
  Vector local_360;
  Vector local_348;
  double local_330;
  double tWeight;
  double rWeight;
  Vector local_308;
  Vector local_2f0;
  Vector local_2d8;
  Vector local_2c0;
  Vector local_2a8;
  double local_290;
  double eta;
  Vector local_270;
  Vector local_258;
  Vector local_240;
  Vector local_228;
  Vector local_210;
  Vector local_1f8;
  Vector local_1e0;
  Vector local_1c8;
  Vector local_1b0;
  Vector local_198;
  Vector local_180;
  Vector local_168;
  int local_150;
  byte local_149;
  int i;
  bool entering;
  double t;
  double vn;
  double ln;
  Vector h;
  double sh;
  Vector l;
  Ray ray;
  SurfaceData txt;
  GeometricObject *obj_local;
  Vector *view_local;
  Vector *p_local;
  double weight_local;
  Medium *curMed_local;
  Scene *this_local;
  Color *color;
  
  txt.map_coord.z = (double)obj;
  Grayzer::SurfaceData::SurfaceData((SurfaceData *)&ray.dir.z);
  Ray::Ray((Ray *)&l.z);
  Vector::Vector(__return_storage_ptr__);
  Vector::Vector((Vector *)&sh);
  Vector::Vector((Vector *)&ln);
  local_149 = 1;
  GeometricObject::find_texture((GeometricObject *)txt.map_coord.z,p,(SurfaceData *)&ray.dir.z);
  t = operator&(view,(Vector *)&txt.p);
  if (0.0 < t) {
    Vector::operator-(&local_168,(Vector *)&txt.p);
    Vector::operator=((Vector *)&txt.p,&local_168);
    t = -t;
    local_149 = 0;
  }
  Vector::operator=((Vector *)&l.z,p);
  operator*(&local_198,&this->ambient,(Vector *)&txt.kt);
  operator*(&local_180,&local_198,ray.dir.z);
  Vector::operator=(__return_storage_ptr__,&local_180);
  for (local_150 = 0; uVar3 = (ulong)local_150,
      sVar4 = std::
              vector<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>::
              size(&this->light), uVar3 < sVar4; local_150 = local_150 + 1) {
    p_Var5 = (__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             std::
             vector<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>::
             operator[](&this->light,(long)local_150);
    peVar6 = std::__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(p_Var5);
    (*peVar6->_vptr_LightSource[2])(peVar6,this,p,&sh);
    if (threshold < extraout_XMM0_Qa) {
      h.z = extraout_XMM0_Qa;
      vn = operator&((Vector *)&sh,(Vector *)&txt.p);
      if (vn <= threshold) {
        if ((threshold < txt.kr) && (vn < -threshold)) {
          _i = -txt.ka * txt.kr * h.z * vn;
          if (threshold < _i) {
            p_Var5 = (__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     std::
                     vector<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                     ::operator[](&this->light,(long)local_150);
            peVar6 = std::__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->(p_Var5);
            operator*(&local_270,&peVar6->color,(Vector *)&txt.kt);
            operator*(&local_258,&local_270,_i);
            Vector::operator+=(__return_storage_ptr__,&local_258);
          }
          _i = txt.kd * txt.kr * h.z;
          if (threshold < _i) {
            operator-((Vector *)&eta,view,(Vector *)&sh);
            iVar2 = Vector::operator>((Vector *)&eta,threshold);
            if (iVar2 != 0) {
              if ((local_149 & 1) == 0) {
                local_488 = Grayzer::Medium::air.ior;
              }
              else {
                local_488 = txt.color.z;
              }
              local_290 = local_488 / curMed->ior;
              Vector::operator-(&local_2d8,view);
              operator*(&local_2f0,(Vector *)&sh,local_290);
              operator-(&local_2c0,&local_2d8,&local_2f0);
              normalize(&local_2a8,&local_2c0);
              Vector::operator=((Vector *)&ln,&local_2a8);
              p_Var5 = (__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )std::
                        vector<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                        ::operator[](&this->light,(long)local_150);
              peVar6 = std::
                       __shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                       operator->(p_Var5);
              operator*((Vector *)&rWeight,&peVar6->color,_i);
              dVar7 = operator&((Vector *)&txt.p,(Vector *)&ln);
              _Var8 = std::pow<double,int>(dVar7,txt.med.beta._0_4_);
              operator*(&local_308,(Vector *)&rWeight,_Var8);
              Vector::operator+=(__return_storage_ptr__,&local_308);
            }
          }
        }
      }
      else {
        if (threshold < txt.ka) {
          p_Var5 = (__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::
                   vector<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                   ::operator[](&this->light,(long)local_150);
          peVar6 = std::__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var5);
          operator*(&local_1c8,&peVar6->color,(Vector *)&txt.kt);
          operator*(&local_1b0,&local_1c8,txt.ka * h.z * vn);
          Vector::operator+=(__return_storage_ptr__,&local_1b0);
        }
        if (threshold < txt.kd) {
          operator-(&local_1f8,(Vector *)&sh,view);
          normalize(&local_1e0,&local_1f8);
          Vector::operator=((Vector *)&ln,&local_1e0);
          p_Var5 = (__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   std::
                   vector<std::shared_ptr<LightSource>,_std::allocator<std::shared_ptr<LightSource>_>_>
                   ::operator[](&this->light,(long)local_150);
          peVar6 = std::__shared_ptr_access<LightSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                   operator->(p_Var5);
          operator*(&local_240,&peVar6->color,txt.kd);
          operator*(&local_228,&local_240,h.z);
          dVar7 = operator&((Vector *)&txt.p,(Vector *)&ln);
          _Var8 = std::pow<double,int>(dVar7,txt.med.beta._0_4_);
          operator*(&local_210,&local_228,_Var8);
          Vector::operator+=(__return_storage_ptr__,&local_210);
        }
      }
    }
  }
  tWeight = weight * txt.ks;
  local_330 = weight * txt.kr;
  if ((threshold < tWeight) && (level < maxLevel)) {
    operator*(&local_360,(Vector *)&txt.p,t * 2.0);
    operator-(&local_348,view,&local_360);
    Vector::operator=((Vector *)&ray.org.z,&local_348);
    trace((Color *)&eta_1,this,curMed,tWeight,(Ray *)&l.z);
    operator*(&local_378,txt.ks,(Vector *)&eta_1);
    Vector::operator+=(__return_storage_ptr__,&local_378);
  }
  if ((threshold < local_330) && (level < maxLevel)) {
    if ((local_149 & 1) == 0) {
      local_4a0 = Grayzer::Medium::air.ior;
    }
    else {
      local_4a0 = txt.color.z;
    }
    ci = curMed->ior / local_4a0;
    ctSq = -t;
    local_3a8 = ci * ci * (ctSq * ctSq + -1.0) + 1.0;
    if (threshold < local_3a8) {
      operator*(&local_3d8,view,ci);
      dVar1 = ci;
      dVar7 = ctSq;
      dVar9 = sqrt(local_3a8);
      operator*(&local_3f0,(Vector *)&txt.p,dVar1 * dVar7 + -dVar9);
      operator+(&local_3c0,&local_3d8,&local_3f0);
      Vector::operator=((Vector *)&ray.org.z,&local_3c0);
      if ((local_149 & 1) == 0) {
        trace(&local_450,this,&Grayzer::Medium::air,local_330,(Ray *)&l.z);
        operator*(&local_438,txt.kr,&local_450);
        Vector::operator+=(__return_storage_ptr__,&local_438);
      }
      else {
        trace(&local_420,this,(Medium *)&txt.color.z,local_330,(Ray *)&l.z);
        operator*(&local_408,txt.kr,&local_420);
        Vector::operator+=(__return_storage_ptr__,&local_408);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Color Scene::shade(Medium& curMed, double weight, Vector p, Vector view, GeometricObject *obj)
{
   SurfaceData txt;
   Ray   ray;
   Color color;
   Vector l;   // light vector
   double sh;  // light shadow coeff.
   Vector h;   // vector between -View and light
   double ln, vn;
   double t;
   bool entering = true; // flag whether we're entering object
   int   i;

   obj->find_texture(p, txt);
   if((vn = view & txt.n) > 0) // force (-View,n) > 0
   {
      txt.n = -txt.n;
      vn = -vn;
      entering = false;
   }

   ray.org = p;
   color = ambient * txt.color * txt.ka; // get ambient light

   for(i = 0; i < light.size(); i++)
   {
      if((sh = light[i]->shadow(this, p,l)) > threshold)
      {
         if((ln = (l & txt.n)) > threshold) //  light is visible
         {
            // Diffuse
            if(txt.kd > threshold)
               color += light[i]->color * txt.color * (txt.kd * sh * ln);

            // Specular & Phong-like
            if(txt.ks > threshold)
            {
               h = normalize(l - view);
               color += light[i]->color * txt.ks * sh * pow(txt.n & h, txt.p);
            }
         }
         else
         if(txt.kt > threshold && ln < -threshold)
         {
            t = -txt.kd * txt.kt * sh * ln;

            if(t > threshold)
               color += light[i]->color * txt.color * t;

            t = txt.ks * txt.kt * sh;

            if(t > threshold)
            {
               if((view - l) > threshold)
               {
                  double eta = (entering ? txt.med.ior : Grayzer::Medium::air.ior) / curMed.ior;
                  h = normalize( -view - l * eta );
                  color += light[i]->color * t * pow(txt.n & h, txt.p);
               }
            }
         }
      }
   }

   double rWeight = weight * txt.kr; // reflected
   double tWeight = weight * txt.kt; // transmitted

   // check for reflected ray
   if(rWeight > threshold && level < maxLevel)
   {
      ray.dir = view - txt.n * (2 * vn); // get reflected ray
      color += txt.kr * trace(curMed, rWeight, ray);
   }

   // check for transmitted ray
   if(tWeight > threshold && level < maxLevel)
   {
      double eta = curMed.ior / (entering ? txt.med.ior : Grayzer::Medium::air.ior);
      double ci = -vn; //  cosine of incident angle
      double ctSq = 1 + eta * eta * (ci *  ci - 1);

      if(ctSq > threshold) // not a Total Internal Reflection
      {
         ray.dir = view * eta + txt.n * (eta * ci - sqrt(ctSq));
         if(entering) // ray enters object
            color += txt.kt * trace(txt.med, tWeight, ray);
         else          // ray leaves object
            color += txt.kt * trace(Grayzer::Medium::air, tWeight, ray);
      }
   }
   return color;
}